

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O2

bool webfront::http::Headers::caseInsensitiveEqual(string_view s1,string_view s2)

{
  bool bVar1;
  
  if (s1._M_len == s2._M_len) {
    bVar1 = ::std::
            equal<char_const*,char_const*,webfront::http::Headers::caseInsensitiveEqual(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::_lambda(char,char)_1_>
                      (s1._M_str,s1._M_str + s1._M_len,s2._M_str);
    return bVar1;
  }
  return false;
}

Assistant:

[[nodiscard]] static constexpr bool caseInsensitiveEqual(std::string_view s1, std::string_view s2) {
        return ((s1.size() == s2.size()) && std::equal(s1.begin(), s1.end(), s2.begin(), [](char c1, char c2) {
                    return (c1 == c2 || std::toupper(c1) == std::toupper(c2));
                }));
    }